

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O0

void __thiscall logfault::LogManager::LogMessage(LogManager *this,Message *message)

{
  bool bVar1;
  reference this_00;
  pointer pHVar2;
  unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_> *h;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
  *__range2;
  lock_guard<std::mutex> lock;
  Message *message_local;
  LogManager *this_local;
  
  lock._M_device = (mutex_type *)message;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range2,&this->mutex_);
  __end2 = std::
           vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
           ::begin(&this->handlers_);
  h = (unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_> *)
      std::
      vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
      ::end(&this->handlers_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_*,_std::vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>_>
                                *)&h);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_*,_std::vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>_>
              ::operator*(&__end2);
    pHVar2 = std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>::operator->
                       (this_00);
    if ((int)message->level_ <= (int)pHVar2->level_) {
      pHVar2 = std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>::
               operator->(this_00);
      (*pHVar2->_vptr_Handler[2])(pHVar2,message);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_*,_std::vector<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>_>
    ::operator++(&__end2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  return;
}

Assistant:

void LogMessage(Message message) {
            std::lock_guard<std::mutex> lock{mutex_};
            for(const auto& h : handlers_) {
                if (h->level_ >= message.level_) {
                    h->LogMessage(message);
                }
            }
        }